

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

unsigned_short __thiscall
duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<duckdb::hugeint_t,unsigned_short>
          (VectorTryCastOperator<duckdb::NumericTryCast> *this,hugeint_t input,ValidityMask *mask,
          idx_t idx,void *dataptr)

{
  bool bVar1;
  unsigned_short uVar2;
  ValidityMask *pVVar3;
  PhysicalType type;
  PhysicalType type_00;
  hugeint_t input_00;
  hugeint_t input_01;
  unsigned_short output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  input_01.lower = input.lower;
  input_01.upper = (int64_t)&output;
  pVVar3 = mask;
  bVar1 = Hugeint::TryCast<unsigned_short>((Hugeint *)this,input_01,(uint16_t *)mask);
  if (!bVar1) {
    TypeIdToString_abi_cxx11_(&local_50,(duckdb *)0xcc,type);
    ::std::operator+(&local_d0,"Type ",&local_50);
    ::std::operator+(&local_b0,&local_d0," with value ");
    input_00.upper = (int64_t)pVVar3;
    input_00.lower = input_01.lower;
    ConvertToString::Operation<duckdb::hugeint_t>(&local_f0,(ConvertToString *)this,input_00);
    ::std::operator+(&local_90,&local_b0,&local_f0);
    ::std::operator+(&local_70,&local_90,
                     " can\'t be cast because the value is out of range for the destination type ");
    TypeIdToString_abi_cxx11_(&local_110,(duckdb *)0x4,type_00);
    ::std::operator+(&local_130,&local_70,&local_110);
    ::std::__cxx11::string::~string((string *)&local_110);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)&local_50);
    uVar2 = HandleVectorCastError::Operation<unsigned_short>
                      (&local_130,(ValidityMask *)input.upper,(idx_t)mask,(VectorTryCastData *)idx);
    ::std::__cxx11::string::~string((string *)&local_130);
    output = uVar2;
  }
  return output;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}